

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O0

void fwd_txfm2d_sse4_1(int16_t *input,int32_t *output,int stride,TXFM_2D_FLIP_CFG *cfg,
                      int32_t *txfm_buf)

{
  int txfm1d_size;
  __m128i *input_00;
  __m128i *input_01;
  byte *in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  int16_t *in_RDI;
  __m128i *in_R8;
  int txfm2d_size_128;
  int num_per_128;
  __m128i *out_128;
  __m128i *buf_128;
  TxfmFuncSSE2 txfm_func_row;
  TxfmFuncSSE2 txfm_func_col;
  int8_t cos_bit_row;
  int8_t cos_bit_col;
  int8_t *stage_range_row;
  int8_t *stage_range_col;
  int8_t *shift;
  int txfm_size;
  undefined2 in_stack_ffffffffffffffb4;
  int txfm_size_00;
  
  txfm1d_size = tx_size_wide[*in_RCX];
  txfm_size_00 = CONCAT13(in_RCX[0x18],CONCAT12(in_RCX[0x19],in_stack_ffffffffffffffb4));
  input_00 = (__m128i *)fwd_txfm_type_to_func(in_RCX[0x32]);
  input_01 = (__m128i *)fwd_txfm_type_to_func(in_RCX[0x33]);
  int16_array_with_stride_to_int32_array_without_stride(in_RDI,in_EDX,(int32_t *)in_R8,txfm1d_size);
  av1_round_shift_array_32_sse4_1(input_01,in_R8,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  (*(code *)input_00)(in_RSI,in_R8,(int)(char)((uint)txfm_size_00 >> 0x18),in_RCX + 0x1a);
  av1_round_shift_array_32_sse4_1(input_01,in_R8,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  transpose_32(txfm_size_00,input_00,input_01);
  (*(code *)input_01)(in_R8,in_RSI,(int)(char)((uint)txfm_size_00 >> 0x10),in_RCX + 0x26);
  av1_round_shift_array_32_sse4_1(input_01,in_R8,(int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  return;
}

Assistant:

static inline void fwd_txfm2d_sse4_1(const int16_t *input, int32_t *output,
                                     const int stride,
                                     const TXFM_2D_FLIP_CFG *cfg,
                                     int32_t *txfm_buf) {
  // TODO(sarahparker) This does not currently support rectangular transforms
  // and will break without splitting txfm_size out into row and col size.
  // Rectangular transforms use c code only, so it should be ok for now.
  // It will be corrected when there are sse implementations for rectangular
  // transforms.
  assert(cfg->tx_size < TX_SIZES);
  const int txfm_size = tx_size_wide[cfg->tx_size];
  const int8_t *shift = cfg->shift;
  const int8_t *stage_range_col = cfg->stage_range_col;
  const int8_t *stage_range_row = cfg->stage_range_row;
  const int8_t cos_bit_col = cfg->cos_bit_col;
  const int8_t cos_bit_row = cfg->cos_bit_row;
  const TxfmFuncSSE2 txfm_func_col = fwd_txfm_type_to_func(cfg->txfm_type_col);
  const TxfmFuncSSE2 txfm_func_row = fwd_txfm_type_to_func(cfg->txfm_type_row);

  __m128i *buf_128 = (__m128i *)txfm_buf;
  __m128i *out_128 = (__m128i *)output;
  int num_per_128 = 4;
  int txfm2d_size_128 = txfm_size * txfm_size / num_per_128;

  int16_array_with_stride_to_int32_array_without_stride(input, stride, txfm_buf,
                                                        txfm_size);
  av1_round_shift_array_32_sse4_1(buf_128, out_128, txfm2d_size_128, -shift[0]);
  txfm_func_col(out_128, buf_128, cos_bit_col, stage_range_col);
  av1_round_shift_array_32_sse4_1(buf_128, out_128, txfm2d_size_128, -shift[1]);
  transpose_32(txfm_size, out_128, buf_128);
  txfm_func_row(buf_128, out_128, cos_bit_row, stage_range_row);
  av1_round_shift_array_32_sse4_1(out_128, out_128, txfm2d_size_128, -shift[2]);
}